

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
::
emplace_new_key<slang::BufferID,ska::flat_hash_map<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,BufferID *key,
          convertible_to_value *args)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
  pVar7;
  bool local_95 [13];
  templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  local_88;
  iterator result;
  value_type to_insert;
  templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  local_58 [3];
  convertible_to_value *local_40;
  convertible_to_value *args_local;
  BufferID *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
  *this_local;
  bool local_10;
  
  local_40 = args;
  args_local = (convertible_to_value *)key;
  key_local = (BufferID *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 8) != 0) &&
     ((sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
       )distance_from_desired != this[0x11])) {
    lVar3 = *(long *)(this + 0x18) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 8) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x14)) {
      bVar1 = sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
              ::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
        ::
        emplace<slang::BufferID,ska::flat_hash_map<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>::convertible_to_value>
                  ((sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                    *)key_local,(int8_t)current_entry_local._7_1_,(BufferID *)args_local,local_40);
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
        ::
        templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
        ::templated_iterator(local_58,(EntryPointer)key_local);
        to_insert.second.
        super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
                            *)&this_local,local_58,
                           (bool *)((long)&to_insert.second.
                                           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        std::
        pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
        ::
        pair<slang::BufferID,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>::convertible_to_value,_true>
                  ((pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                    *)&result,(BufferID *)args_local,local_40);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::
        swap<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>
                  ((pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                    *)&result,
                   (pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                    *)(key_local + 2));
        sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
        ::
        templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
        ::templated_iterator(&local_88,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = key_local + 10;
            bVar1 = sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                    ::is_empty((sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                                *)key_local);
            if (bVar1) {
              sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
              ::
              emplace<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                        ((sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                          *)key_local,(int8_t)current_entry_local._7_1_,
                         (pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                          *)&result);
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              local_95[0] = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
                          *)&this_local,&local_88,local_95);
              goto LAB_00284a97;
            }
            if ((char)current_entry_local._7_1_ <= (char)key_local->id) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::
            swap<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>
                      ((pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                        *)&result,
                       (pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                        *)(key_local + 2));
            current_entry_local._7_1_ =
                 (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x11]);
        std::
        swap<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>
                  ((pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                    *)&result,&((local_88.current)->field_1).value);
        sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
        ::grow((sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
                *)this);
        pVar6 = emplace<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                          (this,(pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                                 *)&result);
        this_local = (sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
                      *)pVar6.first.current;
        local_10 = pVar6.second;
LAB_00284a97:
        std::
        pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
        ::~pair((pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                 *)&result);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_00284aa0;
    }
  }
  sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
          *)this);
  pVar6 = emplace<slang::BufferID,ska::flat_hash_map<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>,slang::Hasher<slang::BufferID>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>::convertible_to_value>
                    (this,(BufferID *)args_local,local_40);
  local_10 = pVar6.second;
LAB_00284aa0:
  this_local = (sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }